

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakelibraryinfo.cpp
# Opt level: O3

void QMakeLibraryInfo::reload(void)

{
  Type *this;
  
  QLibraryInfoPrivate::reload();
  if ((__atomic_base<signed_char>)
      QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qmake_library_settings>::guard._q_value.
      super___atomic_base<signed_char>._M_i != -1) {
    return;
  }
  this = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qmake_library_settings>_>
         ::instance();
  QMakeLibrarySettings::load(this);
  return;
}

Assistant:

void QMakeLibraryInfo::reload()
{
    QLibraryInfoPrivate::reload();
    if (qmake_library_settings.exists())
        qmake_library_settings->load();
}